

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool pmu_8_1_events_supported(CPUARMState_conflict *env)

{
  _Bool _Var1;
  ArchCPU_conflict2 *pAVar2;
  CPUARMState_conflict *env_local;
  
  pAVar2 = env_archcpu(env);
  _Var1 = isar_feature_any_pmu_8_1(&pAVar2->isar);
  return _Var1;
}

Assistant:

static bool pmu_8_1_events_supported(CPUARMState *env)
{
    /* For events which are supported in any v8.1 PMU */
    return cpu_isar_feature(any_pmu_8_1, env_archcpu(env));
}